

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v8::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  bigint *pbVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int local_54;
  
  uVar3 = lhs1->exp_;
  iVar13 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + uVar3;
  uVar4 = lhs2->exp_;
  iVar14 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + uVar4;
  iVar16 = iVar14;
  if (iVar14 < iVar13) {
    iVar16 = iVar13;
  }
  iVar15 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar5 = rhs->exp_;
  iVar1 = iVar5 + iVar15;
  iVar7 = -1;
  if ((iVar1 <= iVar16 + 1) && (iVar7 = 1, iVar16 <= iVar1)) {
    pbVar8 = lhs1;
    if ((int)uVar4 < (int)uVar3) {
      pbVar8 = lhs2;
    }
    iVar16 = pbVar8->exp_;
    if (iVar5 < iVar16) {
      iVar16 = rhs->exp_;
    }
    uVar17 = 0;
    do {
      iVar2 = iVar5 + iVar15;
      uVar12 = uVar17;
      if (iVar2 <= iVar16) break;
      if (iVar13 < iVar2 || iVar2 <= (int)uVar3) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[~uVar3 + iVar5 + iVar15];
      }
      if (iVar14 < iVar2 || iVar2 <= (int)uVar4) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[~uVar4 + iVar5 + iVar15];
      }
      if (iVar1 < iVar2 || iVar2 <= iVar5) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[iVar15 - 1];
      }
      uVar12 = (uVar11 + uVar17) - (uVar10 + uVar9);
      if (uVar11 + uVar17 < uVar10 + uVar9) {
        local_54 = 1;
        bVar6 = false;
        uVar12 = uVar17;
      }
      else {
        bVar6 = uVar12 < 2;
        if (bVar6) {
          uVar12 = uVar12 << 0x20;
        }
        else {
          local_54 = -1;
        }
      }
      iVar15 = iVar15 + -1;
      uVar17 = uVar12;
    } while (bVar6);
    iVar7 = -(uint)(uVar12 != 0);
    if (iVar16 < iVar2) {
      iVar7 = local_54;
    }
  }
  return iVar7;
}

Assistant:

FMT_CONSTEXPR20 int num_bigits() const {
    return static_cast<int>(bigits_.size()) + exp_;
  }